

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

void __thiscall
QDialogButtonBoxPrivate::removeButton
          (QDialogButtonBoxPrivate *this,QAbstractButton *button,RemoveReason reason)

{
  int in_EDX;
  QObject *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  QAbstractButton **in_stack_ffffffffffffff78;
  Object *in_stack_ffffffffffffff80;
  QObject *pQVar1;
  undefined4 in_stack_ffffffffffffff88;
  QWidget *in_stack_ffffffffffffff98;
  QWidget *in_stack_ffffffffffffffa0;
  Function in_stack_ffffffffffffffb0;
  offset_in_QObject_to_subr signal;
  int local_28;
  QObject *local_18;
  QObject *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (QObject *)0x0) {
    local_10 = in_RSI;
    QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
    ::remove((QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
              *)(in_RDI + 0x3c0),(char *)&local_10);
    for (local_28 = 0; local_28 < 9; local_28 = local_28 + 1) {
      QList<QAbstractButton*>::removeOne<QAbstractButton*>
                ((QList<QAbstractButton_*> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    if (in_EDX != 0) {
      if (in_EDX == 1) {
        QWidget::setParent(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        signal = 0;
        QObjectPrivate::
        disconnect<void(QAbstractButton::*)(bool),void(QDialogButtonBoxPrivate::*)()>
                  ((Object *)CONCAT44(in_EDX,in_stack_ffffffffffffff88),0,in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffffb0);
        QObjectPrivate::disconnect<void(QObject::*)(QObject*),void(QDialogButtonBoxPrivate::*)()>
                  ((Object *)CONCAT44(in_EDX,in_stack_ffffffffffffff88),signal,
                   in_stack_ffffffffffffff80,0);
        pQVar1 = local_10;
        std::unique_ptr<QObject,_std::default_delete<QObject>_>::get
                  ((unique_ptr<QObject,_std::default_delete<QObject>_> *)0x66dc17);
        QObject::removeEventFilter(pQVar1);
      }
      else if (in_EDX != 2) goto LAB_0066dc48;
      local_18 = local_10;
      QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
      ::remove((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                *)(in_RDI + 0x330),(char *)&local_18);
    }
  }
LAB_0066dc48:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialogButtonBoxPrivate::removeButton(QAbstractButton *button, RemoveReason reason)
{
    if (!button)
        return;

    // Remove button from hidden buttons and roles
    hiddenButtons.remove(button);
    for (int i = 0; i < QDialogButtonBox::NRoles; ++i)
        buttonLists[i].removeOne(button);

    switch (reason) {
    case RemoveReason::ManualRemove:
        button->setParent(nullptr);
        QObjectPrivate::disconnect(button, &QAbstractButton::clicked,
                                   this, &QDialogButtonBoxPrivate::handleButtonClicked);
        QObjectPrivate::disconnect(button, &QAbstractButton::destroyed,
                                   this, &QDialogButtonBoxPrivate::handleButtonDestroyed);
        button->removeEventFilter(filter.get());
        Q_FALLTHROUGH();
    case RemoveReason::Destroyed:
        standardButtonMap.remove(reinterpret_cast<QPushButton *>(button));
        break;
    case RemoveReason::HideEvent:
        break;
    }
}